

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app3.cpp
# Opt level: O2

ostream * operator<<(ostream *str,Student *stu)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(str,(string *)stu);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(stu->gpa).value);
  std::endl<char,std::char_traits<char>>(poVar1);
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const Student& stu)
{
    str << stu.name << ", " << stu.gpa.value << std::endl;
    return str;
}